

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypspur-interpreter.c
# Opt level: O0

int proc_spur(char *line,int *coordinate)

{
  int local_2c;
  int ret;
  char *toksave;
  char *line_div;
  int *coordinate_local;
  char *line_local;
  
  local_2c = 0;
  line_div = (char *)coordinate;
  coordinate_local = (int *)line;
  toksave = strtok_r(line,";\n\r",(char **)&stack0xffffffffffffffd8);
  while ((toksave != (char *)0x0 &&
         (local_2c = proc_spur_cmd(toksave,(int *)line_div), -1 < local_2c))) {
    toksave = strtok_r((char *)0x0,";\n\r",(char **)&stack0xffffffffffffffd8);
  }
  return local_2c;
}

Assistant:

int proc_spur(char* line, int* coordinate)
{
  char* line_div;
  char* toksave;
  int ret;

  ret = 0;
  line_div = strtok_r(line, ";\n\r", &toksave);
  while (line_div)
  {
    ret = proc_spur_cmd(line_div, coordinate);
    if (ret < 0)
    {
      break;
    }
    line_div = strtok_r(NULL, ";\n\r", &toksave);
  }
  return ret;
}